

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall Parser::traceIn(Parser *this,string *rname)

{
  ostream *poVar1;
  char *pcVar2;
  RefCount<Token> local_40;
  string local_38 [32];
  
  poVar1 = std::operator<<((ostream *)&std::cout,"enter ");
  poVar1 = std::operator<<(poVar1,(string *)rname);
  poVar1 = std::operator<<(poVar1,"; LA(1)==");
  (*this->_vptr_Parser[5])(&local_40,this,1);
  (*(local_40.ref)->ptr->_vptr_Token[2])(local_38);
  poVar1 = std::operator<<(poVar1,local_38);
  pcVar2 = "";
  if (0 < ((this->inputState).ref)->ptr->guessing) {
    pcVar2 = " [guessing]";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string(local_38);
  RefCount<Token>::~RefCount(&local_40);
  return;
}

Assistant:

void Parser::traceIn(const std::string& rname)
{
	std::cout << "enter " << rname << "; LA(1)==" << LT(1)->getText() <<
			((inputState->guessing>0)?" [guessing]":"") << std::endl;
}